

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

ValueType * __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<1>::find_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,int *key)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar8;
  int iVar9;
  
  uVar4 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = uVar4 >> 10;
  uVar1 = (this->occupation).occupation;
  if ((uVar1 >> (uVar2 & 0x3f) & 1) != 0) {
    lVar6 = POPCOUNT(uVar1 >> ((byte)uVar2 & 0x3f));
    uVar4 = uVar4 & 0xffff;
    pHVar8 = (this->entries)._M_elems + lVar6 + -2;
    lVar5 = (lVar6 << 0x20) + -0x200000000;
    do {
      pHVar8 = pHVar8 + 1;
      lVar7 = lVar6 + 1;
      lVar5 = lVar5 + 0x100000000;
      lVar3 = lVar6 + -1;
      lVar6 = lVar7;
    } while (uVar4 < (this->hashes)._M_elems[lVar3]);
    iVar9 = this->size + 2;
    if (iVar9 != (int)lVar7) {
      while( true ) {
        if ((this->hashes)._M_elems[lVar7 + -2] != uVar4) {
          return (ValueType *)0x0;
        }
        if (*key == pHVar8->key_) break;
        lVar5 = lVar5 + 0x100000000;
        lVar7 = lVar7 + 1;
        pHVar8 = pHVar8 + 1;
        if (iVar9 == (int)lVar7) {
          return (ValueType *)0x0;
        }
      }
      return &(this->entries)._M_elems[lVar5 >> 0x20].value_;
    }
  }
  return (ValueType *)0x0;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }